

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool basic_test_64bit(string *vals,double val)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  runtime_error *this;
  char cVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  ulong uVar20;
  char *pcVar21;
  char *ptr;
  char *pcVar22;
  byte bVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  bool bVar27;
  double result_value;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," parsing ",9);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(vals->_M_dataplus)._M_p,vals->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  ptr = (vals->_M_dataplus)._M_p;
  cVar2 = *ptr;
  pcVar21 = ptr;
  cVar15 = cVar2;
  if (cVar2 == '-') {
    cVar15 = ptr[1];
    if ((byte)(cVar15 - 0x30U) < 10) {
      pcVar21 = ptr + 1;
      goto LAB_001065be;
    }
LAB_001067ba:
    pcVar21 = " I could not parse ";
    lVar17 = 0x13;
  }
  else {
LAB_001065be:
    if (cVar15 != '0') {
      if ((byte)(cVar15 - 0x30U) < 10) {
        uVar20 = (ulong)(byte)(cVar15 - 0x30U);
        bVar23 = pcVar21[1];
        pcVar24 = pcVar21;
        while( true ) {
          pcVar26 = pcVar24 + 1;
          if (9 < (byte)(bVar23 - 0x30)) break;
          uVar20 = (ulong)(byte)(bVar23 - 0x30) + uVar20 * 10;
          bVar23 = pcVar24[2];
          pcVar24 = pcVar26;
        }
        goto LAB_00106621;
      }
      goto LAB_001067ba;
    }
    bVar23 = pcVar21[1];
    if ((byte)(bVar23 - 0x30) < 10) goto LAB_001067ba;
    pcVar26 = pcVar21 + 1;
    uVar20 = 0;
LAB_00106621:
    if (bVar23 == 0x2e) {
      if (9 < (byte)(pcVar26[1] - 0x30U)) goto LAB_001067ba;
      uVar20 = (ulong)(byte)(pcVar26[1] - 0x30U) + uVar20 * 10;
      pcVar25 = pcVar26 + 2;
      bVar23 = pcVar26[2];
      while ((byte)(bVar23 - 0x30) < 10) {
        uVar20 = (ulong)(byte)(bVar23 - 0x30) + uVar20 * 10;
        pbVar1 = (byte *)(pcVar25 + 1);
        pcVar25 = pcVar25 + 1;
        bVar23 = *pbVar1;
      }
      pcVar24 = pcVar26 + (1 - (long)pcVar25);
      pcVar26 = pcVar25;
    }
    else {
      pcVar24 = (char *)0x0;
    }
    pcVar25 = pcVar26;
    if ((bVar23 | 0x20) == 0x65) {
      bVar27 = (pcVar26[1] - 0x2bU & 0xfd) == 0;
      pcVar22 = pcVar26 + 1;
      if (bVar27) {
        pcVar22 = pcVar26 + 2;
      }
      bVar23 = pcVar26[(ulong)bVar27 + 1] - 0x30;
      if (9 < bVar23) goto LAB_001067ba;
      bVar19 = pcVar22[1] - 0x30;
      uVar14 = (ulong)bVar19 + (ulong)bVar23 * 10;
      if (9 < bVar19) {
        uVar14 = (ulong)bVar23;
      }
      pcVar25 = pcVar22 + 2;
      if (9 < bVar19) {
        pcVar25 = pcVar22 + 1;
      }
      bVar23 = pcVar22[(ulong)(bVar19 < 10) + 1] - 0x30;
      pcVar25 = pcVar25 + (bVar23 < 10);
      uVar13 = (ulong)bVar23 + uVar14 * 10;
      if (9 < bVar23) {
        uVar13 = uVar14;
      }
      cVar3 = *pcVar25;
      while ((byte)(cVar3 - 0x30U) < 10) {
        if ((long)uVar13 < 0x100000000) {
          uVar13 = (ulong)(byte)(cVar3 - 0x30U) + uVar13 * 10;
        }
        pcVar22 = pcVar25 + 1;
        pcVar25 = pcVar25 + 1;
        cVar3 = *pcVar22;
      }
      uVar14 = -uVar13;
      if (pcVar26[1] != '-') {
        uVar14 = uVar13;
      }
      pcVar24 = pcVar24 + uVar14;
    }
    if ((int)(~(uint)pcVar21 + (int)pcVar26) < 0x13) {
LAB_00106787:
      if (pcVar24 + -0x135 < (char *)0xfffffffffffffd86) goto LAB_0010679b;
      if ((uVar20 >> 0x35 == 0) && (pcVar24 + 0x16 < (char *)0x2d)) {
        if ((long)pcVar24 < 0) {
          local_38 = (double)(long)uVar20 /
                     *(double *)
                      (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                       power_of_ten + (long)pcVar24 * -8);
        }
        else {
          local_38 = (double)(long)uVar20 *
                     *(double *)
                      (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                       power_of_ten + (long)pcVar24 * 8);
        }
        if (cVar2 == '-') {
          local_38 = -local_38;
        }
      }
      else {
        if (uVar20 != 0) {
          uVar14 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar20 = uVar20 << ((byte)(uVar14 ^ 0x3f) & 0x3f);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar20;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(fast_double_parser::
                                    compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64 +
                                   (long)pcVar24 * 8 + 0xa28);
          auVar4 = auVar4 * auVar6;
          uVar12 = auVar4._0_8_;
          uVar13 = auVar4._8_8_ & 0x1ff;
          if ((uVar13 == 0x1ff) && (uVar13 = 0x1ff, CARRY8(uVar12,uVar20))) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar20;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(fast_double_parser::
                                      compute_float_64(long,unsigned_long,bool,bool*)::mantissa_128
                                     + (long)pcVar24 * 8 + 0xa28);
            uVar18 = SUB168(auVar5 * auVar7,8);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar18;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar18;
            auVar9 = auVar4 + auVar9;
            auVar8 = auVar4 + auVar8;
            uVar16 = auVar4._8_4_ + (uint)CARRY8(uVar12,uVar18) & 0x1ff;
            uVar13 = (ulong)uVar16;
            auVar4 = auVar9;
            if ((!CARRY8(SUB168(auVar5 * auVar7,0),uVar20)) ||
               ((uVar12 + uVar18 != -1 || (auVar4 = auVar8, uVar16 != 0x1ff)))) goto LAB_00106899;
          }
          else {
LAB_00106899:
            uVar20 = auVar4._8_8_ >> (9U - (auVar4[0xf] >> 7) & 0x3f);
            uVar16 = (uint)uVar20;
            if ((auVar4._0_8_ != 0) || ((uVar13 != 0 || ((uVar16 & 3) != 1)))) {
              uVar20 = (uVar16 & 1) + uVar20;
              uVar13 = uVar20 >> 0x36;
              uVar14 = (((long)pcVar24 * 0x3526a >> 0x10) + 0x43f) -
                       ((auVar4._8_8_ >> 0x3f ^ 1) + (uVar14 ^ 0x3f) + -1 + (ulong)(uVar13 == 0));
              if ((uVar14 != 0) && (uVar14 < 0x7ff)) {
                uVar12 = 0;
                if (uVar13 == 0) {
                  uVar12 = uVar20 >> 1 & 0xefffffffffffff;
                }
                local_38 = (double)((ulong)(cVar2 == '-') << 0x3f | uVar12 | uVar14 << 0x34);
                goto LAB_00106978;
              }
            }
          }
          local_38 = 0.0;
          goto LAB_0010679b;
        }
        if (cVar2 == '-') {
          local_38 = -0.0;
        }
        else {
          local_38 = 0.0;
        }
      }
    }
    else {
      lVar17 = 1;
      while ((cVar15 == '0' || (cVar15 == '.'))) {
        pcVar22 = pcVar21 + lVar17;
        lVar17 = lVar17 + 1;
        cVar15 = *pcVar22;
      }
      if ((int)(((int)pcVar26 - (uint)pcVar21) - (int)lVar17) < 0x13) goto LAB_00106787;
LAB_0010679b:
      pcVar25 = fast_double_parser::parse_float_strtod(ptr,&local_38);
      if (pcVar25 == (char *)0x0) goto LAB_001067ba;
      ptr = (vals->_M_dataplus)._M_p;
    }
LAB_00106978:
    dVar10 = local_38;
    if (pcVar25 != ptr + vals->_M_string_length) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"gap is ",7);
      poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar11);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"does not point at the end.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (NAN(val)) {
      if (NAN(local_38)) {
LAB_00106b89:
        *(uint *)(puts + *(long *)(std::cout + -0x18)) =
             *(uint *)(puts + *(long *)(std::cout + -0x18)) | 0x104;
        poVar11 = std::ostream::_M_insert<double>(local_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," == ",4);
        poVar11 = std::ostream::_M_insert<double>(val);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        *(uint *)(puts + *(long *)(std::cout + -0x18)) =
             *(uint *)(puts + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"not nan",7);
      poVar11 = std::ostream::_M_insert<double>(dVar10);
      goto LAB_001067e4;
    }
    if ((local_38 == val) && (!NAN(local_38) && !NAN(val))) goto LAB_00106b89;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I got ",6);
    *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
         *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) | 0x104;
    poVar11 = std::ostream::_M_insert<double>(dVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," but I was expecting ",0x15);
    poVar11 = std::ostream::_M_insert<double>(val);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
         *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 2;
    pcVar21 = "string: ";
    lVar17 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar21,lVar17);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(vals->_M_dataplus)._M_p,vals->_M_string_length);
LAB_001067e4:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  return false;
}

Assistant:

bool basic_test_64bit(std::string vals, double val) {
  std::cout << " parsing "  << vals << std::endl;
  double result_value;
  const char * ok = fast_double_parser::parse_number(vals.c_str(), & result_value);
  if (!ok) {
    std::cerr << " I could not parse " << vals << std::endl;
    return false;
  }
  if(ok != vals.c_str() + vals.size()) {
    std::cout << "gap is " << (ok - vals.c_str()) << std::endl;
    throw std::runtime_error("does not point at the end.");

  }   
  if (std::isnan(val)) {
    if (!std::isnan(result_value)) {
      std::cerr << "not nan" << result_value << std::endl;
      return false;
    }
  } else if (result_value != val) {
    std::cerr << "I got " << std::hexfloat << result_value << " but I was expecting " << val
              << std::endl;
    std::cerr << std::dec;
    std::cerr << "string: " << vals << std::endl;
    return false;
  }
  std::cout << std::hexfloat << result_value << " == " << val << std::endl;
  std::cout << std::dec;

  return true;
}